

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ParseSamplers
          (ConversionStream *this,iterator *Token,SamplerHashType *SamplersHash)

{
  TokenListType *pTVar1;
  _List_node_base **Args;
  int iVar2;
  uint uVar3;
  _List_node_base *p_Var4;
  int iVar5;
  string *in_R8;
  int iVar6;
  string msg;
  String local_50;
  
  p_Var4 = Token->_M_node;
  iVar5 = *(int *)&p_Var4[1]._M_next;
  if (((iVar5 != 0x133) && (iVar5 != 0x135)) &&
     (p_Var4 != (this->m_Tokens).
                super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                ._M_impl._M_node.super__List_node_base._M_next)) {
    FormatString<char[26],char[104]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Token->Type == TokenType::OpenParen || Token->Type == TokenType::OpenBrace || Token == m_Tokens.begin()"
               ,(char (*) [104])this);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ParseSamplers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x4b2);
    std::__cxx11::string::~string((string *)&msg);
    p_Var4 = Token->_M_node;
    iVar5 = *(int *)&p_Var4[1]._M_next;
  }
  p_Var4 = p_Var4->_M_next;
  Token->_M_node = p_Var4;
  pTVar1 = &this->m_Tokens;
  iVar6 = 1;
LAB_001c1ce5:
  if ((p_Var4 == (_List_node_base *)pTVar1) || (iVar6 == 0)) {
    if ((iVar6 != 0) && ((iVar6 != 1 || (p_Var4 != (_List_node_base *)pTVar1)))) {
      FormatString<char[20]>(&msg,(char (*) [20])"Error parsing scope");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_50,this,Token,4);
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseSamplers",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x50d,&msg,(char (*) [2])0x2c8293,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&msg);
    }
    return;
  }
  iVar2 = *(int *)&p_Var4[1]._M_next;
  switch(iVar2) {
  case 0x133:
  case 0x135:
    iVar6 = iVar6 + 1;
    break;
  case 0x134:
  case 0x136:
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) {
      return;
    }
    break;
  default:
    if (iVar2 != 0x10d) {
      if (iVar6 == 1 && iVar2 == 0x10e) goto LAB_001c1d46;
      break;
    }
    if (iVar6 != 1) break;
LAB_001c1d46:
    Args = &p_Var4[1]._M_prev;
    p_Var4 = p_Var4->_M_next;
    Token->_M_node = p_Var4;
    do {
      if (p_Var4 == (_List_node_base *)pTVar1) {
        FormatString<char[19],std::__cxx11::string,char[13]>
                  (&msg,(Diligent *)"Unexpected EOF in ",(char (*) [19])Args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d14fc,
                   (char (*) [13])in_R8);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_50,this,Token,4);
        in_R8 = &msg;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseSamplers",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x4dd,&msg,(char (*) [2])0x2c8293,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&msg);
        p_Var4 = Token->_M_node;
      }
      if (*(int *)&p_Var4[1]._M_next != 0x13b) {
        FormatString<char[23],std::__cxx11::string,char[13]>
                  (&msg,(Diligent *)"Missing identifier in ",(char (*) [23])Args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d14fc,
                   (char (*) [13])in_R8);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_50,this,Token,4);
        in_R8 = &msg;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseSamplers",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x4de,&msg,(char (*) [2])0x2c8293,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&msg);
        p_Var4 = Token->_M_node;
      }
      std::__cxx11::string::string((string *)&msg,(string *)&p_Var4[1]._M_prev);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,bool>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)SamplersHash,&msg);
      std::__cxx11::string::~string((string *)&msg);
      p_Var4 = Token->_M_node->_M_next;
      Token->_M_node = p_Var4;
      if (iVar5 == 0x135) break;
      while (p_Var4 != (_List_node_base *)pTVar1) {
        uVar3 = *(uint *)&p_Var4[1]._M_next;
        if ((uVar3 & 0xfffffffe) == 0x13e) goto LAB_001c1efd;
        p_Var4 = p_Var4->_M_next;
        Token->_M_node = p_Var4;
      }
      FormatString<char[30],std::__cxx11::string,char[13]>
                (&msg,(Diligent *)"Unexpected EOF while parsing ",(char (*) [30])Args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d14fc,
                 (char (*) [13])in_R8);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_50,this,Token,4);
      in_R8 = &msg;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseSamplers",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x4f8,&msg,(char (*) [2])0x2c8293,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&msg);
      p_Var4 = Token->_M_node;
      uVar3 = *(uint *)&p_Var4[1]._M_next;
LAB_001c1efd:
      if (uVar3 != 0x13f) break;
      p_Var4 = p_Var4->_M_next;
      Token->_M_node = p_Var4;
    } while (p_Var4 != (_List_node_base *)pTVar1);
    goto LAB_001c1ce5;
  }
  p_Var4 = p_Var4->_M_next;
  Token->_M_node = p_Var4;
  goto LAB_001c1ce5;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ParseSamplers(TokenListType::iterator& Token, SamplerHashType& SamplersHash)
{
    VERIFY_EXPR(Token->Type == TokenType::OpenParen || Token->Type == TokenType::OpenBrace || Token == m_Tokens.begin());
    Uint32 ScopeDepth             = 1;
    bool   IsFunctionArgumentList = Token->Type == TokenType::OpenParen;

    // Skip scope start symbol, which is either open bracket or m_Tokens.begin()
    ++Token;
    while (Token != m_Tokens.end() && ScopeDepth > 0)
    {
        if (Token->Type == TokenType::OpenParen ||
            Token->Type == TokenType::OpenBrace)
        {
            // Increase scope depth
            ++ScopeDepth;
            ++Token;
        }
        else if (Token->Type == TokenType::ClosingParen ||
                 Token->Type == TokenType::ClosingBrace)
        {
            // Decrease scope depth
            --ScopeDepth;
            if (ScopeDepth == 0)
                break;
            ++Token;
        }
        else if ((Token->Type == TokenType::kw_SamplerState ||
                  Token->Type == TokenType::kw_SamplerComparisonState) &&
                 // ONLY parse sampler states in the current scope, skip
                 // all nested scopes
                 ScopeDepth == 1)
        {
            const auto& SamplerType   = Token->Literal;
            bool        bIsComparison = Token->Type == TokenType::kw_SamplerComparisonState;
            // SamplerState LinearClamp;
            // ^
            ++Token;

            // There may be a number of samplers declared after single
            // Sampler[Comparison]State keyword:
            // SamplerState Tex2D1_sampler, Tex2D2_sampler;
            do
            {
                // SamplerState LinearClamp;
                //              ^
                VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF in ", SamplerType, " declaration");
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Missing identifier in ", SamplerType, " declaration");
                const auto& SamplerName = Token->Literal;

                // Add sampler state into the hash map
                SamplersHash.insert(std::make_pair(SamplerName, bIsComparison));

                ++Token;
                // SamplerState LinearClamp ;
                //                          ^

                // We cannot just remove sampler declarations, because samplers can
                // be passed to functions as arguments.
                // SamplerState and SamplerComparisonState are #defined as int, so all
                // sampler variables will just be unused global variables or function parameters.
                // Hopefully GLSL compiler will be able to optimize them out.

                if (IsFunctionArgumentList)
                {
                    // In function argument list, every argument
                    // has its own type declaration
                    break;
                }

                // Go to the next sampler declaration or statement end
                while (Token != m_Tokens.end() && Token->Type != TokenType::Comma && Token->Type != TokenType::Semicolon)
                    ++Token;
                VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while parsing ", SamplerType, " declaration");

                if (Token->Type == TokenType::Comma)
                {
                    // SamplerState Tex2D1_sampler, Tex2D2_sampler ;
                    //                            ^
                    ++Token;
                    // SamplerState Tex2D1_sampler, Tex2D2_sampler ;
                    //                              ^
                }
                else
                {
                    // SamplerState Tex2D1_sampler, Tex2D2_sampler ;
                    //                                             ^
                    break;
                }
            } while (Token != m_Tokens.end());
        }
        else
            ++Token;
    }
    VERIFY_PARSER_STATE(Token, (ScopeDepth == 1 && Token == m_Tokens.end()) || ScopeDepth == 0, "Error parsing scope");
}